

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O1

void gz_compress(FILE *in,gzFile out)

{
  char *pcVar1;
  FILE *__stream;
  int iVar2;
  uint uVar3;
  int32_t iVar4;
  gzFile __ptr;
  size_t sVar5;
  char *pcVar6;
  gzFile file;
  uint len;
  gzFile unaff_R15;
  int iStack_44;
  gzFile pgStack_40;
  FILE *pFStack_38;
  gzFile pgStack_30;
  
  file = (gzFile)0x4000;
  pgStack_30 = (gzFile)0x10428a;
  __ptr = (gzFile)calloc(0x4000,1);
  if (__ptr == (gzFile)0x0) {
LAB_00104306:
    pgStack_30 = (gzFile)0x10430b;
    gz_compress_cold_3();
  }
  else {
    do {
      pgStack_30 = (gzFile)0x1042a7;
      sVar5 = fread(__ptr,1,0x4000,(FILE *)in);
      pgStack_30 = (gzFile)0x1042b2;
      iVar2 = ferror((FILE *)in);
      unaff_R15 = __ptr;
      if (iVar2 != 0) {
        pgStack_30 = (gzFile)0x104306;
        file = __ptr;
        gz_compress_cold_1();
        goto LAB_00104306;
      }
      len = (uint)sVar5;
      if (len == 0) goto LAB_001042d6;
      pgStack_30 = (gzFile)0x1042c9;
      uVar3 = zng_gzwrite(out,__ptr,len);
    } while (uVar3 == len);
    pgStack_30 = (gzFile)0x1042d6;
    gz_fatal(out);
LAB_001042d6:
    pgStack_30 = (gzFile)0x1042de;
    free(__ptr);
    pgStack_30 = (gzFile)0x1042e6;
    fclose((FILE *)in);
    pgStack_30 = (gzFile)0x1042ee;
    file = out;
    iVar4 = zng_gzclose(out);
    if (iVar4 == 0) {
      return;
    }
  }
  pgStack_30 = (gzFile)gz_fatal;
  gz_compress_cold_2();
  __stream = _stderr;
  pcVar1 = prog;
  pgStack_40 = out;
  pFStack_38 = in;
  pgStack_30 = unaff_R15;
  pcVar6 = zng_gzerror(file,&iStack_44);
  fprintf(__stream,"%s: %s\n",pcVar1,pcVar6);
  zng_gzclose(file);
  exit(1);
}

Assistant:

static void gz_compress(FILE *in, gzFile out) {
    char *buf;
    int len;

#ifdef USE_MMAP
    /* Try first compressing with mmap. If mmap fails (minigzip used in a
     * pipe), use the normal fread loop.
     */
    if (gz_compress_mmap(in, out) == Z_OK) return;
#endif
    buf = (char *)calloc(BUFLEN, 1);
    if (buf == NULL) {
        perror("out of memory");
        exit(1);
    }

    for (;;) {
        len = (int)fread(buf, 1, BUFLEN, in);
        if (ferror(in)) {
            free(buf);
            perror("fread");
            exit(1);
        }
        if (len == 0) break;

        if (PREFIX(gzwrite)(out, buf, (unsigned)len) != len) gz_fatal(out);
    }
    free(buf);
    fclose(in);
    if (PREFIX(gzclose)(out) != Z_OK) error("failed gzclose");
}